

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultUnfoundedCheck::propagateFixpoint
          (DefaultUnfoundedCheck *this,Solver *s,PostPropagator *ctx)

{
  bool bVar1;
  uint32 level;
  UfsType UVar2;
  MinimalityCheck *pMVar3;
  Solver *in_RDX;
  DefaultUnfoundedCheck *in_RSI;
  DefaultUnfoundedCheck *in_RDI;
  UfsType t;
  bool checkMin;
  DefaultUnfoundedCheck *in_stack_ffffffffffffffc0;
  bool local_29;
  
  local_29 = false;
  if (in_RDX == (Solver *)0x0) {
    pMVar3 = SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                         *)0x20ee29);
    local_29 = false;
    if (pMVar3 != (MinimalityCheck *)0x0) {
      in_stack_ffffffffffffffc0 =
           (DefaultUnfoundedCheck *)
           SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::
           operator->((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                       *)0x20ee46);
      level = Solver::decisionLevel((Solver *)0x20ee55);
      local_29 = MinimalityCheck::partialCheck((MinimalityCheck *)in_stack_ffffffffffffffc0,level);
    }
  }
  do {
    UVar2 = findUfs(in_RSI,in_RDX,local_29);
    if (UVar2 == ufs_none) {
      return true;
    }
    bVar1 = falsifyUfs(in_RDI,(UfsType)((ulong)in_RSI >> 0x20));
  } while (bVar1);
  resetTodo(in_stack_ffffffffffffffc0);
  return false;
}

Assistant:

bool DefaultUnfoundedCheck::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	bool checkMin = ctx == 0 && mini_.get() && mini_->partialCheck(s.decisionLevel());
	for (UfsType t; (t = findUfs(s, checkMin)) != ufs_none; ) {
		if (!falsifyUfs(t)) {
			resetTodo();
			return false;
		}
	}
	return true;
}